

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void MIR_gen_init(MIR_context_t ctx)

{
  gvn_ctx **ppgVar1;
  MIR_insn_code_t MVar2;
  MIR_context_t pMVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  uint uVar8;
  gen_ctx_t gen_ctx;
  VARR_mem_attr_t *pVVar9;
  mem_attr_t *pmVar10;
  VARR_target_bb_version_t *pVVar11;
  target_bb_version_t *pptVar12;
  bitmap_t pVVar13;
  data_flow_ctx *varr;
  ssa_ctx *psVar14;
  HTAB_def_tab_el_t *pHVar15;
  VARR_HTAB_EL_def_tab_el_t *varr_00;
  HTAB_EL_def_tab_el_t *pHVar16;
  VARR_ssa_edge_t *pVVar17;
  ssa_edge_t_conflict *ppsVar18;
  VARR_char *pVVar19;
  char *pcVar20;
  gvn_ctx *pgVar21;
  VARR_expr_t *pVVar22;
  expr_t *ppeVar23;
  HTAB_expr_t *pHVar24;
  VARR_HTAB_EL_expr_t *varr_01;
  HTAB_EL_expr_t *pHVar25;
  MIR_insn_t_conflict pMVar26;
  VARR_mem_expr_t *pVVar27;
  mem_expr_t *ppmVar28;
  HTAB_mem_expr_t *pHVar29;
  VARR_HTAB_EL_mem_expr_t *varr_02;
  HTAB_EL_mem_expr_t *pHVar30;
  VARR_insn_nop_pair_t *pVVar31;
  insn_nop_pair_t *piVar32;
  lr_ctx *plVar33;
  VARR_live_range_t *pVVar34;
  live_range_t_conflict *pplVar35;
  coalesce_ctx *pcVar36;
  VARR_mv_t *pVVar37;
  mv_t *pmVar38;
  ra_ctx *prVar39;
  VARR_allocno_info_t *pVVar40;
  allocno_info_t *paVar41;
  VARR_spill_el_t *pVVar42;
  spill_el_t *psVar43;
  long lVar44;
  HTAB_lr_gap_t *pHVar45;
  VARR_HTAB_EL_lr_gap_t *varr_03;
  HTAB_EL_lr_gap_t *pHVar46;
  VARR_spill_cache_el_t *pVVar47;
  spill_cache_el_t *psVar48;
  combine_ctx *pcVar49;
  VARR_var_ref_t *pVVar50;
  var_ref_t *pvVar51;
  target_ctx *ptVar52;
  VARR_uint8_t *pVVar53;
  uint8_t *puVar54;
  VARR_const_ref_t *pVVar55;
  const_ref_t *pcVar56;
  VARR_label_ref_t *pVVar57;
  label_ref_t *plVar58;
  VARR_MIR_code_reloc_t *pVVar59;
  MIR_code_reloc_t *pMVar60;
  VARR_call_ref_t *pVVar61;
  call_ref_t *pcVar62;
  char *pcVar63;
  uint64_t uVar64;
  VARR_insn_pattern_info_t *pVVar65;
  insn_pattern_info_t *piVar66;
  void *pvVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  MIR_type_t type;
  ra_ctx **pprVar71;
  char cVar72;
  int iVar73;
  MIR_insn_code_t MVar74;
  undefined8 uVar75;
  size_t sVar76;
  int i;
  MIR_reg_t hard_reg;
  MIR_insn_t_conflict nb;
  undefined4 uVar77;
  target_ctx **pptVar78;
  int iVar79;
  int iVar80;
  bool bVar81;
  bool bVar82;
  undefined1 auVar83 [32];
  undefined4 local_10c;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_e8;
  undefined4 local_e0;
  MIR_op_t local_d8;
  target_ctx **local_a0;
  MIR_context_t local_98;
  MIR_context_t local_90;
  pattern *local_88;
  long local_80;
  ulong local_78;
  MIR_type_t res;
  MIR_var_t args [1];
  
  gen_ctx = (gen_ctx_t)gen_malloc((gen_ctx_t)0x0,0x200);
  ctx->gen_ctx = gen_ctx;
  gen_ctx->ctx = ctx;
  gen_ctx->optimize_level = 2;
  gen_ctx->debug_file = (FILE *)0x0;
  sVar76 = 0;
  gen_ctx->target_ctx = (target_ctx *)0x0;
  gen_ctx->data_flow_ctx = (data_flow_ctx *)0x0;
  gen_ctx->gvn_ctx = (gvn_ctx *)0x0;
  gen_ctx->lr_ctx = (lr_ctx *)0x0;
  gen_ctx->ra_ctx = (ra_ctx *)0x0;
  gen_ctx->combine_ctx = (combine_ctx *)0x0;
  gen_ctx->debug_level = 100;
  VARR_void_ptr_tcreate(&gen_ctx->to_free,0);
  gen_ctx->addr_insn_p = 0;
  VARR_MIR_op_tcreate(&gen_ctx->temp_ops,sVar76);
  VARR_MIR_insn_tcreate(&gen_ctx->temp_insns,sVar76);
  VARR_MIR_insn_tcreate(&gen_ctx->temp_insns2,sVar76);
  VARR_bb_insn_tcreate(&gen_ctx->temp_bb_insns,0x10);
  VARR_bb_insn_tcreate(&gen_ctx->temp_bb_insns2,0x10);
  VARR_loop_node_tcreate(&gen_ctx->loop_nodes,0x20);
  VARR_loop_node_tcreate(&gen_ctx->queue_nodes,0x20);
  VARR_loop_node_tcreate(&gen_ctx->loop_entries,0x10);
  pcVar20 = &DAT_00000018;
  pVVar9 = (VARR_mem_attr_t *)malloc(0x18);
  gen_ctx->mem_attrs = pVVar9;
  if (pVVar9 != (VARR_mem_attr_t *)0x0) {
    pVVar9->els_num = 0;
    pVVar9->size = 0x20;
    pmVar10 = (mem_attr_t *)malloc(0x400);
    pVVar9->varr = pmVar10;
    pcVar20 = &DAT_00000018;
    pVVar11 = (VARR_target_bb_version_t *)malloc(0x18);
    gen_ctx->target_succ_bb_versions = pVVar11;
    if (pVVar11 != (VARR_target_bb_version_t *)0x0) {
      pVVar11->els_num = 0;
      pVVar11->size = 0x10;
      pptVar12 = (target_bb_version_t *)malloc(0x80);
      pVVar11->varr = pptVar12;
      sVar76 = 0x10;
      VARR_void_ptr_tcreate(&gen_ctx->succ_bb_addrs,0x10);
      VARR_spot_attr_tcreate(&gen_ctx->spot_attrs,sVar76);
      VARR_spot_attr_tcreate(&gen_ctx->spot2attr,sVar76);
      pVVar13 = bitmap_create2(0x100);
      gen_ctx->temp_bitmap = pVVar13;
      pVVar13 = bitmap_create2(0x100);
      gen_ctx->temp_bitmap2 = pVVar13;
      pVVar13 = bitmap_create2(0x100);
      gen_ctx->temp_bitmap3 = pVVar13;
      (gen_ctx->free_dead_vars).head = (dead_var_t_conflict)0x0;
      (gen_ctx->free_dead_vars).tail = (dead_var_t_conflict)0x0;
      sVar76 = 0x18;
      varr = (data_flow_ctx *)gen_malloc(gen_ctx,0x18);
      gen_ctx->data_flow_ctx = varr;
      VARR_bb_tcreate((VARR_bb_t **)varr,sVar76);
      VARR_bb_tcreate(&gen_ctx->data_flow_ctx->pending,sVar76);
      pVVar13 = bitmap_create2(0x200);
      gen_ctx->data_flow_ctx->bb_to_consider = pVVar13;
      pcVar20 = (char *)0x40;
      psVar14 = (ssa_ctx *)gen_malloc(gen_ctx,0x40);
      gen_ctx->ssa_ctx = psVar14;
      VARR_bb_insn_tcreate((VARR_bb_insn_t **)psVar14,0);
      VARR_bb_insn_tcreate(&gen_ctx->ssa_ctx->undef_insns,0);
      VARR_bb_insn_tcreate(&gen_ctx->ssa_ctx->phis,0);
      VARR_bb_insn_tcreate(&gen_ctx->ssa_ctx->deleted_phis,0);
      psVar14 = gen_ctx->ssa_ctx;
      pHVar15 = (HTAB_def_tab_el_t *)malloc(0x40);
      if (pHVar15 == (HTAB_def_tab_el_t *)0x0) goto LAB_0012b785;
      pcVar20 = &DAT_00000018;
      varr_00 = (VARR_HTAB_EL_def_tab_el_t *)malloc(0x18);
      pHVar15->els = varr_00;
      if (varr_00 != (VARR_HTAB_EL_def_tab_el_t *)0x0) {
        varr_00->els_num = 0;
        varr_00->size = 0x400;
        local_a0 = &gen_ctx->target_ctx;
        ppgVar1 = &gen_ctx->gvn_ctx;
        pprVar71 = &gen_ctx->ra_ctx;
        pHVar16 = (HTAB_EL_def_tab_el_t *)malloc(0x8000);
        varr_00->varr = pHVar16;
        VARR_HTAB_EL_def_tab_el_ttailor(varr_00,0x400);
        uVar75 = 0x800;
        VARR_htab_ind_tcreate(&pHVar15->entries,0x800);
        pHVar15->arg = gen_ctx;
        iVar73 = 0x800;
        pHVar15->hash_func = def_tab_el_hash;
        pHVar15->eq_func = def_tab_el_eq;
        pHVar15->free_func = (_func_void_def_tab_el_t_void_ptr *)0x0;
        pHVar15->els_num = 0;
        pHVar15->els_start = 0;
        pHVar15->els_bound = 0;
        pHVar15->collisions = 0;
        while (bVar81 = iVar73 != 0, iVar73 = iVar73 + -1, bVar81) {
          VARR_htab_ind_tpush(pHVar15->entries,(htab_ind_t)uVar75);
        }
        psVar14->def_tab = pHVar15;
        psVar14 = gen_ctx->ssa_ctx;
        pcVar20 = &DAT_00000018;
        local_90 = ctx;
        pVVar17 = (VARR_ssa_edge_t *)malloc(0x18);
        psVar14->ssa_edges_to_process = pVVar17;
        if (pVVar17 != (VARR_ssa_edge_t *)0x0) {
          pVVar17->els_num = 0;
          pVVar17->size = 0x200;
          ppsVar18 = (ssa_edge_t_conflict *)malloc(0x1000);
          psVar14 = gen_ctx->ssa_ctx;
          pVVar17->varr = ppsVar18;
          VARR_size_tcreate(&psVar14->curr_reg_indexes,0x1000);
          psVar14 = gen_ctx->ssa_ctx;
          pcVar20 = &DAT_00000018;
          pVVar19 = (VARR_char *)malloc(0x18);
          psVar14->reg_name = pVVar19;
          if (pVVar19 != (VARR_char *)0x0) {
            pVVar19->els_num = 0;
            pVVar19->size = 0x14;
            pcVar20 = (char *)malloc(0x14);
            pVVar19->varr = pcVar20;
            pMVar3 = gen_ctx->ctx;
            pgVar21 = (gvn_ctx *)gen_malloc(gen_ctx,0x30);
            gen_ctx->gvn_ctx = pgVar21;
            pcVar20 = &DAT_00000018;
            pVVar22 = (VARR_expr_t *)malloc(0x18);
            pgVar21->exprs = pVVar22;
            if (pVVar22 != (VARR_expr_t *)0x0) {
              pVVar22->els_num = 0;
              pVVar22->size = 0x200;
              ppeVar23 = (expr_t *)malloc(0x1000);
              pVVar22->varr = ppeVar23;
              pcVar20 = (char *)0x40;
              pHVar24 = (HTAB_expr_t *)malloc(0x40);
              if (pHVar24 == (HTAB_expr_t *)0x0) {
LAB_0012b785:
                mir_htab_error(pcVar20);
              }
              pcVar20 = &DAT_00000018;
              varr_01 = (VARR_HTAB_EL_expr_t *)malloc(0x18);
              pHVar24->els = varr_01;
              if (varr_01 != (VARR_HTAB_EL_expr_t *)0x0) {
                varr_01->els_num = 0;
                varr_01->size = 0x400;
                pHVar25 = (HTAB_EL_expr_t *)malloc(0x4000);
                varr_01->varr = pHVar25;
                VARR_HTAB_EL_expr_ttailor(varr_01,0x400);
                uVar75 = 0x800;
                VARR_htab_ind_tcreate(&pHVar24->entries,0x800);
                iVar73 = 0x800;
                pHVar24->arg = gen_ctx;
                pHVar24->hash_func = expr_hash;
                pHVar24->eq_func = expr_eq;
                pHVar24->free_func = (_func_void_expr_t_void_ptr *)0x0;
                pHVar24->els_num = 0;
                pHVar24->els_start = 0;
                pHVar24->els_bound = 0;
                pHVar24->collisions = 0;
                while (bVar81 = iVar73 != 0, iVar73 = iVar73 + -1, bVar81) {
                  VARR_htab_ind_tpush(pHVar24->entries,(htab_ind_t)uVar75);
                }
                pgVar21->expr_tab = pHVar24;
                _MIR_new_var_mem_op(&local_d8,pMVar3,MIR_T_I64,0,0xffffffff,0xffffffff,'\0');
                _MIR_new_var_op(pMVar3,0);
                pMVar26 = MIR_new_insn(pMVar3,MIR_MOV);
                pgVar21 = *ppgVar1;
                pgVar21->temp_mem_insn = pMVar26;
                pcVar20 = &DAT_00000018;
                pVVar27 = (VARR_mem_expr_t *)malloc(0x18);
                pgVar21->mem_exprs = pVVar27;
                if (pVVar27 != (VARR_mem_expr_t *)0x0) {
                  pVVar27->els_num = 0;
                  pVVar27->size = 0x100;
                  ppmVar28 = (mem_expr_t *)malloc(0x800);
                  pgVar21 = *ppgVar1;
                  pVVar27->varr = ppmVar28;
                  pcVar20 = (char *)0x40;
                  pHVar29 = (HTAB_mem_expr_t *)malloc(0x40);
                  if (pHVar29 == (HTAB_mem_expr_t *)0x0) goto LAB_0012b785;
                  pcVar20 = &DAT_00000018;
                  varr_02 = (VARR_HTAB_EL_mem_expr_t *)malloc(0x18);
                  pHVar29->els = varr_02;
                  if (varr_02 != (VARR_HTAB_EL_mem_expr_t *)0x0) {
                    varr_02->els_num = 0;
                    varr_02->size = 0x200;
                    pHVar30 = (HTAB_EL_mem_expr_t *)malloc(0x2000);
                    varr_02->varr = pHVar30;
                    VARR_HTAB_EL_mem_expr_ttailor(varr_02,0x200);
                    uVar75 = 0x400;
                    VARR_htab_ind_tcreate(&pHVar29->entries,0x400);
                    iVar73 = 0x400;
                    pHVar29->arg = gen_ctx;
                    pHVar29->hash_func = mem_expr_hash;
                    pHVar29->eq_func = mem_expr_eq;
                    pHVar29->free_func = (_func_void_mem_expr_t_void_ptr *)0x0;
                    pHVar29->els_num = 0;
                    pHVar29->els_start = 0;
                    pHVar29->els_bound = 0;
                    pHVar29->collisions = 0;
                    while (bVar81 = iVar73 != 0, iVar73 = iVar73 + -1, bVar81) {
                      VARR_htab_ind_tpush(pHVar29->entries,(htab_ind_t)uVar75);
                    }
                    pgVar21->mem_expr_tab = pHVar29;
                    pgVar21 = *ppgVar1;
                    pcVar20 = &DAT_00000018;
                    pVVar31 = (VARR_insn_nop_pair_t *)malloc(0x18);
                    pgVar21->insn_nop_pairs = pVVar31;
                    if (pVVar31 != (VARR_insn_nop_pair_t *)0x0) {
                      pVVar31->els_num = 0;
                      pVVar31->size = 0x10;
                      piVar32 = (insn_nop_pair_t *)malloc(0x100);
                      pVVar31->varr = piVar32;
                      plVar33 = (lr_ctx *)gen_malloc(gen_ctx,0x68);
                      sVar76 = 0;
                      gen_ctx->lr_ctx = plVar33;
                      VARR_intcreate(&plVar33->var_to_scan_var_map,0);
                      VARR_MIR_reg_tcreate(&gen_ctx->lr_ctx->scan_var_to_var_map,sVar76);
                      plVar33 = gen_ctx->lr_ctx;
                      pcVar20 = &DAT_00000018;
                      pVVar34 = (VARR_live_range_t *)malloc(0x18);
                      plVar33->free_lr_list = (live_range_t_conflict)0x0;
                      plVar33->free_lr_bb_list = (lr_bb_t_conflict)0x0;
                      plVar33->var_live_ranges = pVVar34;
                      if (pVVar34 != (VARR_live_range_t *)0x0) {
                        pVVar34->els_num = 0;
                        pVVar34->size = 0x40;
                        pplVar35 = (live_range_t_conflict *)malloc(0x200);
                        plVar33 = gen_ctx->lr_ctx;
                        pVVar34->varr = pplVar35;
                        VARR_intcreate(&plVar33->point_map,0x400);
                        pVVar13 = bitmap_create2(0x100);
                        gen_ctx->lr_ctx->live_vars = pVVar13;
                        pVVar13 = bitmap_create2(0x100);
                        gen_ctx->lr_ctx->referenced_vars = pVVar13;
                        pVVar13 = bitmap_create2(0x100);
                        gen_ctx->lr_ctx->points_with_born_vars = pVVar13;
                        pVVar13 = bitmap_create2(0x100);
                        gen_ctx->lr_ctx->points_with_dead_vars = pVVar13;
                        pVVar13 = bitmap_create2(0x100);
                        gen_ctx->lr_ctx->points_with_born_or_dead_vars = pVVar13;
                        sVar76 = 0x20;
                        pcVar36 = (coalesce_ctx *)gen_malloc(gen_ctx,0x20);
                        gen_ctx->coalesce_ctx = pcVar36;
                        pcVar20 = &DAT_00000018;
                        pVVar37 = (VARR_mv_t *)malloc(0x18);
                        pcVar36->moves = pVVar37;
                        if (pVVar37 != (VARR_mv_t *)0x0) {
                          pVVar37->els_num = 0;
                          pVVar37->size = 0x40;
                          pmVar38 = (mv_t *)malloc(0x400);
                          pVVar37->varr = pmVar38;
                          VARR_MIR_reg_tcreate(&pcVar36->first_coalesced_reg,sVar76);
                          VARR_MIR_reg_tcreate(&gen_ctx->coalesce_ctx->next_coalesced_reg,sVar76);
                          pVVar13 = bitmap_create();
                          sVar76 = 0x248;
                          gen_ctx->coalesce_ctx->conflict_matrix = pVVar13;
                          prVar39 = (ra_ctx *)gen_malloc(gen_ctx,0x248);
                          gen_ctx->ra_ctx = prVar39;
                          VARR_MIR_reg_tcreate(&prVar39->reg_renumber,sVar76);
                          prVar39 = gen_ctx->ra_ctx;
                          pcVar20 = &DAT_00000018;
                          pVVar40 = (VARR_allocno_info_t *)malloc(0x18);
                          prVar39->sorted_regs = pVVar40;
                          if (pVVar40 != (VARR_allocno_info_t *)0x0) {
                            pVVar40->els_num = 0;
                            pVVar40->size = 0x40;
                            paVar41 = (allocno_info_t *)malloc(0x400);
                            prVar39 = *pprVar71;
                            pVVar40->varr = paVar41;
                            VARR_bitmap_tcreate(&prVar39->used_locs,sVar76);
                            VARR_bitmap_tcreate(&(*pprVar71)->busy_used_locs,sVar76);
                            VARR_bitmap_tcreate(&(*pprVar71)->var_bbs,sVar76);
                            VARR_lr_gap_tcreate(&(*pprVar71)->spill_gaps,sVar76);
                            VARR_lr_gap_tcreate(&(*pprVar71)->curr_gaps,sVar76);
                            prVar39 = *pprVar71;
                            pcVar20 = &DAT_00000018;
                            pVVar42 = (VARR_spill_el_t *)malloc(0x18);
                            prVar39->spill_els = pVVar42;
                            if (pVVar42 != (VARR_spill_el_t *)0x0) {
                              pVVar42->els_num = 0;
                              pVVar42->size = 0x40;
                              psVar43 = (spill_el_t *)malloc(0x400);
                              pVVar42->varr = psVar43;
                              for (lVar44 = 8; prVar39 = *pprVar71, lVar44 != 0x2a;
                                  lVar44 = lVar44 + 1) {
                                prVar39->lr_gap_bitmaps[lVar44 + -8] = (bitmap_t)0x0;
                              }
                              pcVar20 = (char *)0x40;
                              pHVar45 = (HTAB_lr_gap_t *)malloc(0x40);
                              if (pHVar45 == (HTAB_lr_gap_t *)0x0) goto LAB_0012b785;
                              pcVar20 = &DAT_00000018;
                              varr_03 = (VARR_HTAB_EL_lr_gap_t *)malloc(0x18);
                              pHVar45->els = varr_03;
                              if (varr_03 != (VARR_HTAB_EL_lr_gap_t *)0x0) {
                                varr_03->els_num = 0;
                                varr_03->size = 0x400;
                                pHVar46 = (HTAB_EL_lr_gap_t *)malloc(0x6000);
                                varr_03->varr = pHVar46;
                                VARR_HTAB_EL_lr_gap_ttailor(varr_03,0x400);
                                uVar75 = 0x800;
                                VARR_htab_ind_tcreate(&pHVar45->entries,0x800);
                                pHVar45->arg = (void *)0x0;
                                iVar73 = 0x800;
                                pHVar45->hash_func = lr_gap_hash;
                                pHVar45->eq_func = lr_gap_eq;
                                pHVar45->free_func = (_func_void_lr_gap_t_void_ptr *)0x0;
                                pHVar45->els_num = 0;
                                pHVar45->els_start = 0;
                                pHVar45->els_bound = 0;
                                pHVar45->collisions = 0;
                                while (bVar81 = iVar73 != 0, iVar73 = iVar73 + -1, bVar81) {
                                  VARR_htab_ind_tpush(pHVar45->entries,(htab_ind_t)uVar75);
                                }
                                prVar39->lr_gap_tab = pHVar45;
                                prVar39 = *pprVar71;
                                pcVar20 = &DAT_00000018;
                                pVVar47 = (VARR_spill_cache_el_t *)malloc(0x18);
                                prVar39->spill_cache = pVVar47;
                                if (pVVar47 != (VARR_spill_cache_el_t *)0x0) {
                                  pVVar47->els_num = 0;
                                  pVVar47->size = 0x40;
                                  psVar48 = (spill_cache_el_t *)malloc(0x200);
                                  pVVar47->varr = psVar48;
                                  gen_ctx->ra_ctx->spill_cache_age = 0;
                                  pVVar13 = bitmap_create2(0x31);
                                  gen_ctx->ra_ctx->conflict_locs1 = pVVar13;
                                  pcVar49 = (combine_ctx *)gen_malloc(gen_ctx,0x50);
                                  pcVar49->curr_bb_var_ref_age = 0;
                                  gen_ctx->combine_ctx = pcVar49;
                                  sVar76 = 0;
                                  VARR_size_tcreate((VARR_size_t **)pcVar49,0);
                                  pcVar49 = gen_ctx->combine_ctx;
                                  pcVar20 = &DAT_00000018;
                                  pVVar50 = (VARR_var_ref_t *)malloc(0x18);
                                  pcVar49->var_refs = pVVar50;
                                  if (pVVar50 != (VARR_var_ref_t *)0x0) {
                                    pVVar50->els_num = 0;
                                    pVVar50->size = 0x40;
                                    pvVar51 = (var_ref_t *)malloc(0x800);
                                    pcVar49 = gen_ctx->combine_ctx;
                                    pVVar50->varr = pvVar51;
                                    VARR_MIR_reg_tcreate(&pcVar49->insn_vars,sVar76);
                                    sVar76 = 0x10;
                                    VARR_size_tcreate(&gen_ctx->combine_ctx->changed_op_numbers,0x10
                                                     );
                                    VARR_MIR_op_tcreate(&gen_ctx->combine_ctx->last_right_ops,sVar76
                                                       );
                                    pVVar13 = bitmap_create();
                                    gen_ctx->combine_ctx->vars_bitmap = pVVar13;
                                    local_98 = gen_ctx->ctx;
                                    ptVar52 = (target_ctx *)gen_malloc(gen_ctx,0x68);
                                    gen_ctx->target_ctx = ptVar52;
                                    pcVar20 = &DAT_00000018;
                                    pVVar53 = (VARR_uint8_t *)malloc(0x18);
                                    ptVar52->result_code = pVVar53;
                                    if (pVVar53 != (VARR_uint8_t *)0x0) {
                                      pVVar53->els_num = 0;
                                      pVVar53->size = 0x40;
                                      puVar54 = (uint8_t *)malloc(0x40);
                                      pVVar53->varr = puVar54;
                                      sVar76 = 0;
                                      VARR_intcreate(&ptVar52->insn_pattern_indexes,0);
                                      pptVar78 = local_a0;
                                      VARR_uint64_tcreate(&(*local_a0)->const_pool,sVar76);
                                      ptVar52 = *pptVar78;
                                      pcVar20 = &DAT_00000018;
                                      pVVar55 = (VARR_const_ref_t *)malloc(0x18);
                                      ptVar52->const_refs = pVVar55;
                                      if (pVVar55 != (VARR_const_ref_t *)0x0) {
                                        pVVar55->els_num = 0;
                                        pVVar55->size = 0x40;
                                        pcVar56 = (const_ref_t *)malloc(0xa00);
                                        ptVar52 = *pptVar78;
                                        pVVar55->varr = pcVar56;
                                        pcVar20 = &DAT_00000018;
                                        pVVar57 = (VARR_label_ref_t *)malloc(0x18);
                                        ptVar52->label_refs = pVVar57;
                                        if (pVVar57 != (VARR_label_ref_t *)0x0) {
                                          pVVar57->els_num = 0;
                                          pVVar57->size = 0x40;
                                          plVar58 = (label_ref_t *)malloc(0x800);
                                          ptVar52 = *pptVar78;
                                          pVVar57->varr = plVar58;
                                          VARR_uint64_tcreate(&ptVar52->abs_address_locs,sVar76);
                                          ptVar52 = *pptVar78;
                                          pcVar20 = &DAT_00000018;
                                          pVVar59 = (VARR_MIR_code_reloc_t *)malloc(0x18);
                                          ptVar52->relocs = pVVar59;
                                          if (pVVar59 != (VARR_MIR_code_reloc_t *)0x0) {
                                            pVVar59->els_num = 0;
                                            pVVar59->size = 0x40;
                                            pMVar60 = (MIR_code_reloc_t *)malloc(0x400);
                                            ptVar52 = *pptVar78;
                                            pVVar59->varr = pMVar60;
                                            pcVar20 = &DAT_00000018;
                                            pVVar61 = (VARR_call_ref_t *)malloc(0x18);
                                            ptVar52->call_refs = pVVar61;
                                            if (pVVar61 != (VARR_call_ref_t *)0x0) {
                                              pVVar61->els_num = 0;
                                              pVVar61->size = 0x40;
                                              pcVar62 = (call_ref_t *)malloc(0x400);
                                              auVar4 = _DAT_001a7cd0;
                                              pVVar61->varr = pcVar62;
                                              auVar5 = _DAT_001a7cd0;
                                              lVar44 = 0;
                                              res = MIR_T_D;
                                              args[0].size = 0;
                                              _DAT_001a7cd0 = auVar4._0_4_;
                                              _UNK_001a7cd4 = auVar4._4_4_;
                                              _UNK_001a7cd8 = auVar4._8_8_;
                                              args[0].type = _DAT_001a7cd0;
                                              args[0]._4_4_ = _UNK_001a7cd4;
                                              args[0].name = (char *)_UNK_001a7cd8;
                                              _DAT_001a7cd0 = auVar5;
                                              _MIR_register_unspec_insn
                                                        (gen_ctx->ctx,0,"movdqa",1,&res,1,0,args);
                                              VARR_intcreate(&gen_ctx->target_ctx->pattern_indexes,0
                                                            );
                                              pptVar78 = local_a0;
LAB_0012ae12:
                                              if (lVar44 != 0x2d9) {
                                                pcVar20 = patterns[lVar44].replacement;
                                                local_88 = patterns + lVar44;
                                                uVar70 = 0;
                                                local_80 = lVar44;
LAB_0012ae45:
                                                iVar79 = 0;
                                                iVar80 = 0;
                                                iVar73 = 0;
                                                uVar77 = 0;
                                                local_e8 = 0;
                                                local_10c = 0;
                                                local_e0 = 0;
                                                local_fc = 0;
                                                local_f8 = 0;
                                                uVar69 = 0;
                                                local_f4 = 0;
                                                bVar81 = false;
                                                bVar6 = false;
                                                local_78 = uVar70;
LAB_0012aeb2:
                                                lVar44 = local_80;
                                                pptVar78 = local_a0;
                                                cVar72 = *pcVar20;
                                                local_d8.data = pcVar20;
                                                if ((cVar72 == '\0') || (cVar72 == ';'))
                                                goto LAB_0012b247;
                                                uVar68 = 1;
                                                if (((int)cVar72 - 0x30U < 10) ||
                                                   (pcVar63 = pcVar20,
                                                   '6' < cVar72 && (int)cVar72 - 0x41U < 6)) {
                                                  if (iVar79 != 0) {
                                                    if (iVar80 == 0) {
                                                      iVar80 = 1;
                                                    }
                                                    else {
                                                      iVar80 = 1;
                                                      bVar82 = iVar73 != 0;
                                                      iVar73 = 1;
                                                      if (bVar82) {
                                                        __assert_fail("!opcode2_p",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x90d,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  }
                                                  }
                                                  pcVar63 = pcVar20 + 2;
                                                  iVar79 = 1;
                                                  cVar72 = pcVar20[2];
                                                }
                                                local_d8.data = pcVar63;
                                                uVar8 = local_f8;
                                                switch(cVar72) {
                                                case 'H':
                                                case 'h':
                                                  local_d8.data = pcVar63 + 1;
                                                  read_hex((char **)&local_d8);
                                                case 'q':
                                                  uVar77 = 1;
                                                  break;
                                                case 'I':
                                                case 'J':
                                                case 'i':
                                                  local_d8.data = pcVar63 + 1;
                                                  if ((pcVar63[1] & 0xf8U) != 0x30) {
                                                    __assert_fail("\'0\' <= ch && ch <= \'7\'",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x948,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  if (cVar72 == 'i') {
                                                    local_f8 = 1;
                                                    uVar8 = local_f8;
                                                  }
                                                  else if (cVar72 == 'I') {
                                                    local_f4 = 1;
                                                  }
                                                  else {
                                                    bVar81 = true;
                                                  }
                                                  break;
                                                case 'K':
                                                case 'M':
                                                case 'N':
                                                case 'O':
                                                case 'Q':
                                                case 'U':
                                                case 'W':
                                                case '[':
                                                case '\\':
                                                case ']':
                                                case '^':
                                                case '_':
                                                case '`':
                                                case 'b':
                                                case 'd':
                                                case 'e':
                                                case 'f':
                                                case 'g':
                                                case 'j':
                                                case 'k':
                                                case 'n':
                                                case 'o':
                                                case 'p':
                                                case 's':
                                                case 't':
                                                case 'u':
switchD_0012af32_caseD_4b:
                                                  __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x988,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                case 'L':
                                                  uVar69 = 1;
                                                  goto LAB_0012b0d8;
                                                case 'P':
                                                  local_d8.data = pcVar63 + 1;
                                                  uVar77 = 1;
                                                  uVar69 = 1;
                                                  if ((pcVar63[1] & 0xf8U) != 0x30) {
                                                    __assert_fail("\'0\' <= ch && ch <= \'7\'",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x95c,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  break;
                                                case 'R':
                                                case 'S':
                                                case 'r':
                                                  local_d8.data = pcVar63 + 1;
                                                  uVar77 = 1;
                                                  if (2 < (byte)(pcVar63[1] - 0x30U)) {
                                                    __assert_fail("\'0\' <= ch && ch <= \'2\'",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x924,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  break;
                                                case 'T':
                                                  uVar77 = 1;
                                                  bVar6 = true;
                                                  break;
                                                case 'V':
                                                case 'v':
                                                  local_d8.data = pcVar63 + 1;
                                                  read_hex((char **)&local_d8);
                                                  uVar8 = uVar68;
                                                  if (cVar72 != 'v') {
                                                    uVar8 = local_f8;
                                                    local_f4 = uVar68;
                                                  }
                                                  break;
                                                case 'X':
                                                case 'Y':
                                                case 'Z':
                                                  if (iVar79 == 0) {
                                                    iVar79 = 0;
                                                    local_e8 = 1;
                                                  }
                                                  else {
                                                    iVar79 = 0;
                                                    local_e8 = 1;
                                                    local_e0 = 1;
                                                    if (iVar80 != 0) {
                                                      __assert_fail("!opcode1_p",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x91a,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  }
                                                  break;
                                                case 'a':
                                                  local_d8.data = pcVar63 + 1;
                                                  cVar72 = pcVar63[1];
                                                  if (cVar72 == 'p') {
                                                    local_10c = 1;
                                                    uVar69 = 1;
                                                  }
                                                  else {
                                                    uVar7 = local_fc;
                                                    if (cVar72 != 'm') {
                                                      if (cVar72 != 'd') {
                                                        __assert_fail("ch == \'m\'",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x941,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  local_d8.data = pcVar63 + 2;
                                                  uVar64 = read_hex((char **)&local_d8);
                                                  uVar7 = uVar68;
                                                  if ((long)(char)uVar64 != uVar64) {
                                                    uVar7 = local_fc;
                                                    uVar69 = uVar68;
                                                  }
                                                  }
                                                  local_fc = uVar7;
                                                  local_10c = 1;
                                                  }
                                                  break;
                                                case 'c':
                                                  local_d8.data = pcVar63 + 1;
                                                  read_hex((char **)&local_d8);
                                                  bVar82 = uVar69 != 0;
                                                  uVar69 = 1;
                                                  if (bVar82) {
                                                    __assert_fail("!disp32_p",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x971,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  break;
                                                case 'l':
                                                  local_fc = 1;
LAB_0012b0d8:
                                                  local_d8.data = pcVar63 + 1;
                                                  if (2 < (byte)(pcVar63[1] - 0x30U)) {
                                                    __assert_fail("\'0\' <= ch && ch <= \'2\'",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x958,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  break;
                                                case 'm':
                                                  local_d8.data = pcVar63 + 1;
                                                  if ((byte)(pcVar63[1] | 0x20U) == 0x74) {
                                                    uVar77 = 1;
                                                    local_10c = 1;
                                                    local_fc = 1;
                                                  }
                                                  else {
                                                    uVar77 = 1;
                                                    local_10c = 1;
                                                    uVar69 = 1;
                                                    if (2 < (byte)(pcVar63[1] - 0x30U)) {
                                                      __assert_fail("\'0\' <= ch && ch <= \'2\'",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x930,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  }
                                                  break;
                                                default:
                                                  if ((cVar72 == '\t') || (cVar72 == ' ')) break;
                                                  if (cVar72 == '+') {
                                                    local_d8.data = pcVar63 + 1;
                                                    if (pcVar63[1] == 'h') {
                                                      iVar79 = 1;
                                                      local_d8.data = pcVar63 + 2;
                                                    }
                                                    else {
                                                      iVar79 = 1;
                                                      if (2 < (byte)(pcVar63[1] - 0x30U)) {
                                                        __assert_fail("\'0\' <= ch && ch <= \'2\'",
                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x96a,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  }
                                                  break;
                                                  }
                                                  if (cVar72 == '/') {
                                                    local_d8.data = pcVar63 + 1;
                                                    uVar77 = 1;
                                                    if ((pcVar63[1] & 0xf8U) != 0x30) {
                                                      __assert_fail("\'0\' <= ch && ch <= \'7\'",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x962,
                                                  "int get_max_insn_size(gen_ctx_t, const char *)");
                                                  }
                                                  break;
                                                  }
                                                  if ((cVar72 != '\0') && (cVar72 != ';'))
                                                  goto switchD_0012af32_caseD_4b;
LAB_0012b247:
                                                  auVar4 = vpinsrd_avx(ZEXT416(local_e8),uVar77,1);
                                                  auVar4 = vpinsrd_avx(auVar4,local_10c,2);
                                                  auVar5 = vpinsrd_avx(ZEXT416(local_fc),iVar79,1);
                                                  auVar5 = vpinsrd_avx(auVar5,iVar80,2);
                                                  auVar5 = vpinsrd_avx(auVar5,iVar73,3);
                                                  auVar4 = vpinsrd_avx(auVar4,local_e0,3);
                                                  auVar83._0_16_ =
                                                       ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
                                                  auVar83._16_16_ = ZEXT116(1) * auVar5;
                                                  uVar75 = vptestmd_avx512vl(auVar83,auVar83);
                                                  iVar73 = (int)local_78 + 4;
                                                  if (uVar69 == 0) {
                                                    iVar73 = (int)local_78;
                                                  }
                                                  uVar68 = (iVar73 + POPCOUNT((int)uVar75) + 1) -
                                                           (uint)(local_f8 == 0);
                                                  uVar69 = uVar68 + 4;
                                                  if (local_f4 == 0) {
                                                    uVar69 = uVar68;
                                                  }
                                                  uVar68 = uVar69 + 8;
                                                  if (!bVar81) {
                                                    uVar68 = uVar69;
                                                  }
                                                  uVar69 = uVar68 + 4;
                                                  if (!bVar6) {
                                                    uVar69 = uVar68;
                                                  }
                                                  uVar70 = (ulong)uVar69;
                                                  pcVar20 = (char *)((long)local_d8.data + 1);
                                                  if (cVar72 == '\0') goto code_r0x0012b2ed;
                                                  goto LAB_0012ae45;
                                                }
                                                local_f8 = uVar8;
                                                pcVar20 = (char *)((long)local_d8.data + 1);
                                                goto LAB_0012aeb2;
                                              }
                                              if ((*pptVar78)->pattern_indexes == (VARR_int *)0x0) {
                                                mir_varr_assert_fail("addr","int");
                                              }
                                              qsort((*pptVar78)->pattern_indexes->varr,0x2d9,4,
                                                    pattern_index_cmp);
                                              ptVar52 = *pptVar78;
                                              pcVar20 = &DAT_00000018;
                                              pVVar65 = (VARR_insn_pattern_info_t *)malloc(0x18);
                                              ptVar52->insn_pattern_info = pVVar65;
                                              if (pVVar65 == (VARR_insn_pattern_info_t *)0x0)
                                              goto LAB_0012b780;
                                              pVVar65->els_num = 0;
                                              pVVar65->size = 0x40;
                                              piVar66 = (insn_pattern_info_t *)malloc(0x200);
                                              iVar73 = 0xbc;
                                              pVVar65->varr = piVar66;
                                              do {
                                                bVar81 = iVar73 == 0;
                                                iVar73 = iVar73 + -1;
                                                pVVar65 = (*pptVar78)->insn_pattern_info;
                                                if (bVar81) {
                                                  if (pVVar65 != (VARR_insn_pattern_info_t *)0x0) {
                                                    piVar66 = pVVar65->varr;
                                                    MVar74 = MIR_INSN_BOUND;
                                                    for (sVar76 = 0; pMVar3 = local_98,
                                                        sVar76 != 0x2d9; sVar76 = sVar76 + 1) {
                                                      iVar73 = VARR_intget((*pptVar78)->
                                                                           pattern_indexes,sVar76);
                                                      MVar2 = patterns[iVar73].code;
                                                      if (MVar2 != MVar74) {
                                                        if (sVar76 == 0) {
                                                          iVar73 = 0;
                                                        }
                                                        else {
                                                          iVar73 = (int)sVar76;
                                                          piVar66[MVar74].num =
                                                               iVar73 - piVar66[MVar74].start;
                                                        }
                                                        piVar66[MVar2].start = iVar73;
                                                        MVar74 = MVar2;
                                                      }
                                                    }
                                                    if (MVar74 != MIR_INSN_BOUND) {
                                                      piVar66[MVar74].num =
                                                           0x2d9 - piVar66[MVar74].start;
                                                      MIR_new_label_op(local_98,(MIR_label_t)0x0);
                                                      pMVar26 = MIR_new_insn(pMVar3,MIR_JMP);
                                                      gen_ctx->target_ctx->temp_jump = pMVar26;
                                                      iVar73 = find_insn_pattern(gen_ctx,pMVar26,
                                                                                 (int *)0x0);
                                                      pMVar3 = local_90;
                                                      gen_ctx->target_ctx->temp_jump_pat_ind =
                                                           iVar73;
                                                      gen_ctx->max_int_hard_regs = 0;
                                                      gen_ctx->max_fp_hard_regs = 0;
                                                      for (hard_reg = 0; hard_reg != 0x22;
                                                          hard_reg = hard_reg + 1) {
                                                        iVar73 = target_fixed_hard_reg_p(hard_reg);
                                                        if (iVar73 == 0) {
                                                          pMVar26 = (MIR_insn_t_conflict)0x4;
                                                          iVar73 = target_hard_reg_type_ok_p
                                                                             (hard_reg,MIR_T_I32);
                                                          if (iVar73 == 0) {
                                                            gen_ctx->max_fp_hard_regs =
                                                                 gen_ctx->max_fp_hard_regs + 1;
                                                          }
                                                          else {
                                                            gen_ctx->max_int_hard_regs =
                                                                 gen_ctx->max_int_hard_regs + 1;
                                                          }
                                                        }
                                                      }
                                                      for (lVar44 = 0; lVar44 != 0x13;
                                                          lVar44 = lVar44 + 1) {
                                                        pVVar13 = bitmap_create2(0x22);
                                                        gen_ctx->call_used_hard_regs[lVar44] =
                                                             pVVar13;
                                                        for (nb = (MIR_insn_t_conflict)0x0;
                                                            nb != (MIR_insn_t_conflict)0x22;
                                                            nb = (MIR_insn_t_conflict)
                                                                 ((long)&nb->data + 1)) {
                                                          iVar73 = target_call_used_hard_reg_p
                                                                             ((MIR_reg_t)nb,
                                                                              (MIR_type_t)pMVar26);
                                                          if (iVar73 != 0) {
                                                            pMVar26 = nb;
                                                            bitmap_set_bit_p(gen_ctx->
                                                  call_used_hard_regs[lVar44],(size_t)nb);
                                                  }
                                                  }
                                                  }
                                                  pVVar13 = bitmap_create2(0x100);
                                                  gen_ctx->tied_regs = pVVar13;
                                                  pVVar13 = bitmap_create2(0x100);
                                                  gen_ctx->addr_regs = pVVar13;
                                                  pVVar13 = bitmap_create2(0x400);
                                                  gen_ctx->insn_to_consider = pVVar13;
                                                  pVVar13 = bitmap_create2(0x22);
                                                  gen_ctx->func_used_hard_regs = pVVar13;
                                                  pvVar67 = _MIR_get_bb_wrapper(pMVar3,gen_ctx,
                                                                                bb_version_generator
                                                                               );
                                                  gen_ctx->bb_wrapper = pvVar67;
                                                  gen_ctx->overall_bbs_num = 0;
                                                  gen_ctx->overall_gen_bbs_num = 0;
                                                  return;
                                                  }
                                                  __assert_fail("prev_code != MIR_INSN_BOUND",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                                  ,0x770,"void patterns_init(gen_ctx_t)");
                                                  }
                                                  pcVar20 = "addr";
LAB_0012b774:
                                                  mir_varr_assert_fail
                                                            (pcVar20,"insn_pattern_info_t");
                                                }
                                                piVar66 = pVVar65->varr;
                                                if (piVar66 == (insn_pattern_info_t *)0x0) {
                                                  pcVar20 = "expand";
                                                  goto LAB_0012b774;
                                                }
                                                sVar76 = pVVar65->els_num;
                                                uVar70 = sVar76 + 1;
                                                if (pVVar65->size < uVar70) {
                                                  sVar76 = (uVar70 >> 1) + uVar70;
                                                  piVar66 = (insn_pattern_info_t *)
                                                            realloc(piVar66,sVar76 * 8);
                                                  pVVar65->varr = piVar66;
                                                  pVVar65->size = sVar76;
                                                  sVar76 = pVVar65->els_num;
                                                  uVar70 = sVar76 + 1;
                                                }
                                                pVVar65->els_num = uVar70;
                                                piVar66[sVar76].start = 0;
                                                piVar66[sVar76].num = 0;
                                              } while( true );
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0012b780:
  mir_varr_error(pcVar20);
code_r0x0012b2ed:
  ptVar52 = *local_a0;
  local_88->max_insn_size = uVar69;
  VARR_intpush(ptVar52->pattern_indexes,(int)local_80);
  lVar44 = lVar44 + 1;
  goto LAB_0012ae12;
}

Assistant:

void MIR_gen_init (MIR_context_t ctx) {
  gen_ctx_t gen_ctx, *gen_ctx_ptr = gen_ctx_loc (ctx);

  *gen_ctx_ptr = gen_ctx = gen_malloc (NULL, sizeof (struct gen_ctx));
  gen_ctx->ctx = ctx;
  optimize_level = 2;
  gen_ctx->target_ctx = NULL;
  gen_ctx->data_flow_ctx = NULL;
  gen_ctx->gvn_ctx = NULL;
  gen_ctx->lr_ctx = NULL;
  gen_ctx->ra_ctx = NULL;
  gen_ctx->combine_ctx = NULL;
#if !MIR_NO_GEN_DEBUG
  debug_file = NULL;
  debug_level = 100;
#endif
  VARR_CREATE (void_ptr_t, to_free, 0);
  addr_insn_p = FALSE;
  VARR_CREATE (MIR_op_t, temp_ops, 16);
  VARR_CREATE (MIR_insn_t, temp_insns, 16);
  VARR_CREATE (MIR_insn_t, temp_insns2, 16);
  VARR_CREATE (bb_insn_t, temp_bb_insns, 16);
  VARR_CREATE (bb_insn_t, temp_bb_insns2, 16);
  VARR_CREATE (loop_node_t, loop_nodes, 32);
  VARR_CREATE (loop_node_t, queue_nodes, 32);
  VARR_CREATE (loop_node_t, loop_entries, 16);
  VARR_CREATE (mem_attr_t, mem_attrs, 32);
  VARR_CREATE (target_bb_version_t, target_succ_bb_versions, 16);
  VARR_CREATE (void_ptr_t, succ_bb_addrs, 16);
  VARR_CREATE (spot_attr_t, spot_attrs, 32);
  VARR_CREATE (spot_attr_t, spot2attr, 32);
  temp_bitmap = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  temp_bitmap2 = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  temp_bitmap3 = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  init_dead_vars (gen_ctx);
  init_data_flow (gen_ctx);
  init_ssa (gen_ctx);
  init_gvn (gen_ctx);
  init_live_ranges (gen_ctx);
  init_coalesce (gen_ctx);
  init_ra (gen_ctx);
  init_combine (gen_ctx);
  target_init (gen_ctx);
  max_int_hard_regs = max_fp_hard_regs = 0;
  for (int i = 0; i <= MAX_HARD_REG; i++) {
    if (target_fixed_hard_reg_p (i)) continue;
    target_hard_reg_type_ok_p (i, MIR_T_I32) ? max_int_hard_regs++ : max_fp_hard_regs++;
  }
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++) {
    call_used_hard_regs[type] = bitmap_create2 (MAX_HARD_REG + 1);
    for (int i = 0; i <= MAX_HARD_REG; i++) {
      /* We need call_used_hard_regs even for fixed regs in combine. */
      if (target_call_used_hard_reg_p (i, type)) bitmap_set_bit_p (call_used_hard_regs[type], i);
    }
  }
  tied_regs = bitmap_create2 (256);
  addr_regs = bitmap_create2 (256);
  insn_to_consider = bitmap_create2 (1024);
  func_used_hard_regs = bitmap_create2 (MAX_HARD_REG + 1);
  bb_wrapper = _MIR_get_bb_wrapper (ctx, gen_ctx, bb_version_generator);
  overall_bbs_num = overall_gen_bbs_num = 0;
}